

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_make_lambda(sexp ctx,sexp params)

{
  sexp psVar1;
  
  psVar1 = sexp_alloc_tagged_aux(ctx,0x60,0x1c);
  (psVar1->value).flonum = 3.06320700421573e-322;
  (psVar1->value).type.cpl = params;
  (psVar1->value).port.offset = 0x23e;
  (psVar1->value).port.line = 0x23e;
  (psVar1->value).bytecode.max_depth = 0x23e;
  (psVar1->value).bytecode.length = 0x23e;
  (psVar1->value).port.flags = 0x3e;
  (psVar1->value).port.size = 0x23e;
  return psVar1;
}

Assistant:

sexp sexp_make_lambda (sexp ctx, sexp params) {
  sexp res = sexp_alloc_type(ctx, lambda, SEXP_LAMBDA);
  sexp_lambda_name(res) = SEXP_FALSE;
  sexp_lambda_params(res) = params;
  sexp_lambda_fv(res) = SEXP_NULL;
  sexp_lambda_sv(res) = SEXP_NULL;
  sexp_lambda_locals(res) = SEXP_NULL;
  sexp_lambda_defs(res) = SEXP_NULL;
  sexp_lambda_return_type(res) = SEXP_FALSE;
  sexp_lambda_param_types(res) = SEXP_NULL;
  return res;
}